

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# impl_dispatch_test.cc
# Opt level: O2

void __thiscall
ImplDispatchTest_AES_single_block_Test::TestBody(ImplDispatchTest_AES_single_block_Test *this)

{
  initializer_list<std::pair<unsigned_long,_bool>_> __l;
  allocator_type local_169;
  _Vector_base<std::pair<unsigned_long,_bool>,_std::allocator<std::pair<unsigned_long,_bool>_>_>
  local_168;
  _Any_data local_150;
  code *local_140;
  code *local_138;
  pair<unsigned_long,_bool> local_130;
  undefined8 local_120;
  byte local_118;
  AES_KEY key;
  
  AES_set_encrypt_key("",0x80,(AES_KEY *)&key);
  local_130.first = 1;
  local_130.second = (this->super_ImplDispatchTest).aesni_;
  local_118 = 0;
  if ((this->super_ImplDispatchTest).ssse3_ != false) {
    local_118 = local_130.second ^ 1;
  }
  local_120 = 4;
  __l._M_len = 2;
  __l._M_array = &local_130;
  std::vector<std::pair<unsigned_long,_bool>,_std::allocator<std::pair<unsigned_long,_bool>_>_>::
  vector((vector<std::pair<unsigned_long,_bool>,_std::allocator<std::pair<unsigned_long,_bool>_>_> *
         )&local_168,__l,&local_169);
  local_150._8_8_ = 0;
  local_138 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/impl_dispatch_test.cc:155:7)>
              ::_M_invoke;
  local_140 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/impl_dispatch_test.cc:155:7)>
              ::_M_manager;
  local_150._M_unused._M_object = &key;
  ImplDispatchTest::AssertFunctionsHit
            (&this->super_ImplDispatchTest,
             (vector<std::pair<unsigned_long,_bool>,_std::allocator<std::pair<unsigned_long,_bool>_>_>
              *)&local_168,(function<void_()> *)&local_150);
  std::_Function_base::~_Function_base((_Function_base *)&local_150);
  std::
  _Vector_base<std::pair<unsigned_long,_bool>,_std::allocator<std::pair<unsigned_long,_bool>_>_>::
  ~_Vector_base(&local_168);
  return;
}

Assistant:

TEST_F(ImplDispatchTest, AES_single_block) {
  AES_KEY key;
  static const uint8_t kZeros[16] = {0};
  AES_set_encrypt_key(kZeros, sizeof(kZeros) * 8, &key);

  AssertFunctionsHit(
      {
          {kFlag_aes_hw_encrypt, aesni_},
          {kFlag_vpaes_encrypt, ssse3_ && !aesni_},
      },
      [&key] {
        uint8_t in[AES_BLOCK_SIZE] = {0};
        uint8_t out[AES_BLOCK_SIZE];
        AES_encrypt(in, out, &key);
      });
}